

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

void pfx_export_cb(pfx_record *pfx_record,void *data)

{
  long lVar1;
  tommy_array *array;
  tommy_hashlin *hashlin;
  tommy_uint32_t hash;
  void *pvVar2;
  long in_FS_OFFSET;
  pfx_record_entry *pfx_record_entry;
  tommy_hash_t record_hash;
  tommy_hashlin *roa_hashtable;
  tommy_array *roa_array;
  pfx_export_cb_arg *arg;
  void *data_local;
  pfx_record *pfx_record_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  array = *data;
  hashlin = *(tommy_hashlin **)((long)data + 8);
  hash = hash_pfx_record(pfx_record);
  pvVar2 = tommy_hashlin_search(hashlin,pfx_record_cmp,pfx_record,hash);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = malloc(0x48);
    memcpy(pvVar2,pfx_record,0x28);
    tommy_hashlin_insert(hashlin,(tommy_hashlin_node *)((long)pvVar2 + 0x28),pvVar2,hash);
    tommy_array_insert(array,pvVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void pfx_export_cb(const struct pfx_record *pfx_record, void *data)
{
	struct pfx_export_cb_arg *arg = data;
	tommy_array *roa_array = arg->array;
	tommy_hashlin *roa_hashtable = arg->hashtable;

	tommy_hash_t record_hash = hash_pfx_record(pfx_record);

	if (tommy_hashlin_search(roa_hashtable, &pfx_record_cmp, pfx_record, record_hash) != 0)
		return;

	struct pfx_record_entry *pfx_record_entry = malloc(sizeof(struct pfx_record_entry));

	memcpy(&pfx_record_entry->record, pfx_record, sizeof(struct pfx_record));

	tommy_hashlin_insert(roa_hashtable, &pfx_record_entry->hash_node, pfx_record_entry, record_hash);
	tommy_array_insert(roa_array, pfx_record_entry);
}